

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O1

void * __thiscall
Rml::Detail::BasicStackAllocator::allocate
          (BasicStackAllocator *this,size_t alignment,size_t byte_size)

{
  void *pvVar1;
  uintptr_t pn;
  void *pvVar2;
  
  pvVar1 = this->p;
  pvVar2 = (void *)(-alignment & (long)pvVar1 + (alignment - 1));
  if (((byte *)((byte_size - (long)pvVar1) + (long)pvVar2) <= this->data + (this->N - (long)pvVar1))
     && (this->p = pvVar2, pvVar2 != (void *)0x0)) {
    pvVar1 = this->p;
    this->p = (void *)(byte_size + (long)pvVar1);
    return pvVar1;
  }
  pvVar1 = malloc(byte_size);
  return pvVar1;
}

Assistant:

void* BasicStackAllocator::allocate(size_t alignment, size_t byte_size)
	{
		size_t available_space = N - ((byte*)p - data);

		if (rmlui_align(alignment, byte_size, p, available_space))
		{
			void* result = p;
			p = (byte*)p + byte_size;
			return result;
		}

		// Fall back to malloc
		return malloc(byte_size);
	}